

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O3

void __thiscall KDIS::KDataStream::Read<short>(KDataStream *this,short *T)

{
  pointer puVar1;
  uchar uVar2;
  bool bVar3;
  ushort uVar4;
  bool bVar5;
  uchar *puVar6;
  uchar local_2;
  uchar local_1;
  
  local_2 = (uchar)*T;
  local_1 = *(uchar *)((long)T + 1);
  puVar1 = (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = this->m_ui16CurrentWritePos;
  puVar6 = &local_2;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    *puVar6 = puVar1[uVar4];
    uVar2 = local_2;
    uVar4 = uVar4 + 1;
    this->m_ui16CurrentWritePos = uVar4;
    puVar6 = &local_1;
    bVar3 = false;
  } while (bVar5);
  if (this->m_MachineEndian != this->m_NetEndian) {
    local_2 = local_1;
    local_1 = uVar2;
  }
  *(uchar *)T = local_2;
  *(uchar *)((long)T + 1) = local_1;
  return;
}

Assistant:

void KDataStream::Read( Type & T )
{
    NetToDataType<Type> OctArray( T, false );

    // Copy octets into data type
    for( KUINT8 i = 0; i < sizeof T; ++i, ++m_ui16CurrentWritePos )
    {
        OctArray.m_Octs[i] = m_vBuffer[m_ui16CurrentWritePos];
    }

    if( m_MachineEndian != m_NetEndian )
    {
        OctArray.SwapBytes();
    }

    T = OctArray.m_Value;
}